

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5ExprNodeZeroPoslist(Fts5ExprNode *pNode)

{
  Fts5ExprNearset *pFVar1;
  long lVar2;
  long lVar3;
  
  if ((pNode->eType == 4) || (pNode->eType == 9)) {
    pFVar1 = pNode->pNear;
    lVar2 = (long)pFVar1->nPhrase;
    if (0 < lVar2) {
      lVar3 = 0;
      do {
        (pFVar1->apPhrase[lVar3]->poslist).n = 0;
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
  }
  else if (0 < pNode->nChild) {
    lVar2 = 0;
    do {
      fts5ExprNodeZeroPoslist(pNode->apChild[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < pNode->nChild);
  }
  return;
}

Assistant:

static void fts5ExprNodeZeroPoslist(Fts5ExprNode *pNode){
  if( pNode->eType==FTS5_STRING || pNode->eType==FTS5_TERM ){
    Fts5ExprNearset *pNear = pNode->pNear;
    int i;
    for(i=0; i<pNear->nPhrase; i++){
      Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];
      pPhrase->poslist.n = 0;
    }
  }else{
    int i;
    for(i=0; i<pNode->nChild; i++){
      fts5ExprNodeZeroPoslist(pNode->apChild[i]);
    }
  }
}